

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int16_t envy_bios_parse_power_fan_calib_model
                  (envy_bios_power_fan_calib_entry *e,uint8_t fan_speed,int16_t *div)

{
  uint uVar1;
  short sVar2;
  int iVar3;
  short sVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  short sVar9;
  
  uVar1 = 0x149970 / e->pwm_freq;
  sVar2 = (short)uVar1;
  *div = sVar2;
  iVar3 = (int)sVar2;
  iVar8 = (uint)e->duty_max * iVar3;
  iVar6 = iVar8 + 0xfff;
  if (-1 < iVar8) {
    iVar6 = iVar8;
  }
  iVar7 = e->duty_offset * iVar3;
  iVar8 = iVar7 + 0xfff;
  if (-1 < iVar7) {
    iVar8 = iVar7;
  }
  sVar4 = (short)(iVar8 >> 0xc);
  sVar9 = (short)(iVar6 >> 0xc) + sVar4;
  sVar5 = sVar2;
  if ((int)sVar4 <= (int)sVar9 && -1 < sVar9) {
    iVar6 = (int)(((int)sVar9 - (int)sVar4) * (uint)fan_speed) / 100 + (iVar8 >> 0xc);
    sVar5 = (short)iVar6;
    if (sVar5 < iVar3) {
      iVar3 = (int)sVar5;
    }
    if (iVar3 < 0) {
      return 0;
    }
    iVar6 = iVar6 * 0x10000;
    if (SBORROW4(iVar6,uVar1 * 0x10000) == (int)(iVar6 + uVar1 * -0x10000) < 0) {
      sVar5 = sVar2;
    }
  }
  return sVar5;
}

Assistant:

static int16_t
envy_bios_parse_power_fan_calib_model(struct envy_bios_power_fan_calib_entry *e,
                                      uint8_t fan_speed, int16_t *div) {
	int16_t duty_max, duty_offset, high, low, val;

	*div = 1350000 / e->pwm_freq;
	duty_max = *div * e->duty_max / 4096;
	duty_offset = *div * e->duty_offset / 4096;

	/* TODO: Figure out a better algorithm than this one:
	 * def low_model(pwm_freq, duty_offset):
	 *     div = int(13.5e5 / pwm_freq)
	 *     offset = round(div / 2.4889, 0)
	 *     period = math.floor(pwm_freq * 205 / 65536) - 1
	 *     slope = div / 4096
	 *
	 *     if duty_offset == 0:
	 *         return 0
	 *
	 *     o = 0
	 *     if (duty_offset % period) < period / 2.0:
	 *         o = offset
	 *     else:
	 *         o = 1
	 *
	 *     return min(int(duty_offset * slope + o), div)
	 */
	low = duty_offset;

	/* TODO: Figure out the reason for all these off-by-one that can go either
	 * way...
	 */
	high = duty_max + duty_offset;
	if (high < 0 || low > high)
		return *div;

	/* do a linear interpolation between low and high to get the duty cycle
	 * corresponding to the wanted fan speed
	 */
	val = low + fan_speed * (high - low) / 100;

	return MAX(0, MIN(val, *div));
}